

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectStore.cpp
# Opt level: O1

void __thiscall ObjectStore::~ObjectStore(ObjectStore *this)

{
  pointer pcVar1;
  MutexFactory *this_00;
  pointer ppOVar2;
  MutexLocker lock;
  MutexLocker local_20;
  
  this->_vptr_ObjectStore = (_func_int **)&PTR__ObjectStore_0019fb00;
  MutexLocker::MutexLocker(&local_20,this->storeMutex);
  ppOVar2 = (this->tokens).
            super__Vector_base<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->tokens).super__Vector_base<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppOVar2) {
    (this->tokens).super__Vector_base<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppOVar2;
  }
  for (ppOVar2 = (this->allTokens).
                 super__Vector_base<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      ppOVar2 !=
      (this->allTokens).super__Vector_base<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppOVar2 = ppOVar2 + 1) {
    if (*ppOVar2 != (ObjectStoreToken *)0x0) {
      (*(*ppOVar2)->_vptr_ObjectStoreToken[0xd])();
    }
  }
  MutexLocker::~MutexLocker(&local_20);
  this_00 = MutexFactory::i();
  MutexFactory::recycleMutex(this_00,this->storeMutex);
  pcVar1 = (this->storePath)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->storePath).field_2) {
    operator_delete(pcVar1);
  }
  ppOVar2 = (this->allTokens).
            super__Vector_base<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppOVar2 != (pointer)0x0) {
    operator_delete(ppOVar2);
  }
  ppOVar2 = (this->tokens).
            super__Vector_base<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppOVar2 != (pointer)0x0) {
    operator_delete(ppOVar2);
  }
  return;
}

Assistant:

ObjectStore::~ObjectStore()
{
	{
		MutexLocker lock(storeMutex);

		// Clean up
		tokens.clear();

		for (std::vector<ObjectStoreToken*>::iterator i = allTokens.begin(); i != allTokens.end(); i++)
		{
			delete *i;
		}
	}

	MutexFactory::i()->recycleMutex(storeMutex);
}